

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool __thiscall ClipperLib::Clipper::FixupIntersectionOrder(Clipper *this)

{
  TEdge *Edge1;
  bool bVar1;
  iterator __first;
  iterator __last;
  size_type sVar2;
  reference ppIVar3;
  reference __b;
  byte local_49;
  size_type local_40;
  size_t j;
  size_t i;
  size_t cnt;
  Clipper *this_local;
  
  CopyAELToSEL(this);
  __first = std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>::
            begin(&this->m_IntersectList);
  __last = std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>::
           end(&this->m_IntersectList);
  std::
  sort<__gnu_cxx::__normal_iterator<ClipperLib::IntersectNode**,std::vector<ClipperLib::IntersectNode*,std::allocator<ClipperLib::IntersectNode*>>>,bool(*)(ClipperLib::IntersectNode*,ClipperLib::IntersectNode*)>
            ((__normal_iterator<ClipperLib::IntersectNode_**,_std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>_>
              )__first._M_current,
             (__normal_iterator<ClipperLib::IntersectNode_**,_std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>_>
              )__last._M_current,IntersectListSort);
  sVar2 = std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>::
          size(&this->m_IntersectList);
  j = 0;
  do {
    if (sVar2 <= j) {
      return true;
    }
    ppIVar3 = std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
              ::operator[](&this->m_IntersectList,j);
    bVar1 = EdgesAdjacent(*ppIVar3);
    local_40 = j;
    if (!bVar1) {
      do {
        local_40 = local_40 + 1;
        local_49 = 0;
        if (local_40 < sVar2) {
          ppIVar3 = std::
                    vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
                    ::operator[](&this->m_IntersectList,local_40);
          bVar1 = EdgesAdjacent(*ppIVar3);
          local_49 = bVar1 ^ 0xff;
        }
      } while ((local_49 & 1) != 0);
      if (local_40 == sVar2) {
        return false;
      }
      ppIVar3 = std::
                vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>::
                operator[](&this->m_IntersectList,j);
      __b = std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>::
            operator[](&this->m_IntersectList,local_40);
      std::swap<ClipperLib::IntersectNode*>(ppIVar3,__b);
    }
    ppIVar3 = std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
              ::operator[](&this->m_IntersectList,j);
    Edge1 = (*ppIVar3)->Edge1;
    ppIVar3 = std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
              ::operator[](&this->m_IntersectList,j);
    SwapPositionsInSEL(this,Edge1,(*ppIVar3)->Edge2);
    j = j + 1;
  } while( true );
}

Assistant:

bool Clipper::FixupIntersectionOrder()
{
  //pre-condition: intersections are sorted Bottom-most first.
  //Now it's crucial that intersections are made only between adjacent edges,
  //so to ensure this the order of intersections may need adjusting ...
  CopyAELToSEL();
  std::sort(m_IntersectList.begin(), m_IntersectList.end(), IntersectListSort);
  size_t cnt = m_IntersectList.size();
  for (size_t i = 0; i < cnt; ++i) 
  {
    if (!EdgesAdjacent(*m_IntersectList[i]))
    {
      size_t j = i + 1;
      while (j < cnt && !EdgesAdjacent(*m_IntersectList[j])) j++;
      if (j == cnt)  return false;
      std::swap(m_IntersectList[i], m_IntersectList[j]);
    }
    SwapPositionsInSEL(m_IntersectList[i]->Edge1, m_IntersectList[i]->Edge2);
  }
  return true;
}